

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sst_comm.cpp
# Opt level: O3

int SMPI_Bcast(void *buffer,int count,SMPI_Datatype datatype,int root,SMPI_Comm comm)

{
  long *plVar1;
  Datatype DVar2;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  
  switch(datatype) {
  case SMPI_INT:
    local_48 = local_38;
    local_40 = 0;
    local_38[0] = 0;
    plVar1 = *(long **)comm;
    DVar2 = adios2::helper::CommImpl::GetDatatype<int>();
    (**(code **)(*plVar1 + 0x70))(plVar1,buffer,(long)count,DVar2,root,&local_48);
    break;
  case SMPI_LONG:
    local_48 = local_38;
    local_40 = 0;
    local_38[0] = 0;
    plVar1 = *(long **)comm;
    DVar2 = adios2::helper::CommImpl::GetDatatype<long>();
    (**(code **)(*plVar1 + 0x70))(plVar1,buffer,(long)count,DVar2,root,&local_48);
    break;
  case SMPI_SIZE_T:
    local_48 = local_38;
    local_40 = 0;
    local_38[0] = 0;
    plVar1 = *(long **)comm;
    DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_long>();
    (**(code **)(*plVar1 + 0x70))(plVar1,buffer,(long)count,DVar2,root,&local_48);
    break;
  case SMPI_CHAR:
    local_48 = local_38;
    local_40 = 0;
    local_38[0] = 0;
    plVar1 = *(long **)comm;
    DVar2 = adios2::helper::CommImpl::GetDatatype<char>();
    (**(code **)(*plVar1 + 0x70))(plVar1,buffer,(long)count,DVar2,root,&local_48);
    break;
  case SMPI_BYTE:
    local_48 = local_38;
    local_40 = 0;
    local_38[0] = 0;
    plVar1 = *(long **)comm;
    DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_char>();
    (**(code **)(*plVar1 + 0x70))(plVar1,buffer,(long)count,DVar2,root,&local_48);
    break;
  default:
    goto switchD_00118f2b_default;
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
switchD_00118f2b_default:
  return 0;
}

Assistant:

int SMPI_Bcast(void *buffer, int count, SMPI_Datatype datatype, int root, SMPI_Comm comm)
{
    switch (datatype)
    {
#define F(type) comm->Bcast(static_cast<type *>(buffer), count, root)
        CASE_FOR_EACH_TYPE(F);
#undef F
    }
    return 0;
}